

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaveinfo.c
# Opt level: O0

void si_sdo(int cnt)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint local_14;
  uint local_10;
  int j;
  int i;
  int cnt_local;
  
  ODlist.Entries = 0;
  memset(&ODlist,0,0xbc04);
  iVar1 = ec_readODlist(cnt & 0xffff,&ODlist);
  if (iVar1 == 0) {
    while (EcatError != '\0') {
      uVar2 = ec_elist2string();
      printf("%s",uVar2);
    }
  }
  else {
    printf(" CoE Object Description found, %d entries.\n",(ulong)ODlist.Entries);
    for (local_10 = 0; (int)local_10 < (int)(uint)ODlist.Entries; local_10 = local_10 + 1) {
      ec_readODdescription(local_10 & 0xffff,&ODlist);
      while (EcatError != '\0') {
        uVar2 = ec_elist2string();
        printf("%s",uVar2);
      }
      printf(" Index: %4.4x Datatype: %4.4x Objectcode: %2.2x Name: %s\n",
             (ulong)ODlist.Index[(int)local_10],(ulong)ODlist.DataType[(int)local_10],
             (ulong)ODlist.ObjectCode[(int)local_10],(long)(int)local_10 * 0x29 + 0x108d84);
      memset(&OElist,0,0x3002);
      ec_readOE(local_10 & 0xffff,&ODlist,&OElist);
      while (EcatError != '\0') {
        uVar2 = ec_elist2string();
        printf("%s",uVar2);
      }
      for (local_14 = 0; (int)local_14 < (int)(ODlist.MaxSub[(int)local_10] + 1);
          local_14 = local_14 + 1) {
        if (((OElist.DataType[(int)local_14] != 0) && (OElist.BitLength[(int)local_14] != 0)) &&
           (printf("  Sub: %2.2x Datatype: %4.4x Bitlength: %4.4x Obj.access: %4.4x Name: %s\n",
                   (ulong)local_14,(ulong)OElist.DataType[(int)local_14],
                   (ulong)OElist.BitLength[(int)local_14],(ulong)OElist.ObjAccess[(int)local_14],
                   (long)(int)local_14 * 0x29 + 0x113886),
           (OElist.ObjAccess[(int)local_14] & 7) != 0)) {
          pcVar3 = SDO2string((uint16)cnt,ODlist.Index[(int)local_10],(uint8)local_14,
                              OElist.DataType[(int)local_14]);
          printf("          Value :%s\n",pcVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void si_sdo(int cnt)
{
    int i, j;
    
    ODlist.Entries = 0;
    memset(&ODlist, 0, sizeof(ODlist));
    if( ec_readODlist(cnt, &ODlist))
    {
        printf(" CoE Object Description found, %d entries.\n",ODlist.Entries);
        for( i = 0 ; i < ODlist.Entries ; i++)
        {
            ec_readODdescription(i, &ODlist); 
            while(EcatError) printf("%s", ec_elist2string());
            printf(" Index: %4.4x Datatype: %4.4x Objectcode: %2.2x Name: %s\n",
                ODlist.Index[i], ODlist.DataType[i], ODlist.ObjectCode[i], ODlist.Name[i]);
            memset(&OElist, 0, sizeof(OElist));
            ec_readOE(i, &ODlist, &OElist);
            while(EcatError) printf("%s", ec_elist2string());
            for( j = 0 ; j < ODlist.MaxSub[i]+1 ; j++)
            {
                if ((OElist.DataType[j] > 0) && (OElist.BitLength[j] > 0))
                {
                    printf("  Sub: %2.2x Datatype: %4.4x Bitlength: %4.4x Obj.access: %4.4x Name: %s\n",
                        j, OElist.DataType[j], OElist.BitLength[j], OElist.ObjAccess[j], OElist.Name[j]);
                    if ((OElist.ObjAccess[j] & 0x0007))
                    {
                        printf("          Value :%s\n", SDO2string(cnt, ODlist.Index[i], j, OElist.DataType[j]));
                    }
                }
            }   
        }   
    }
    else
    {
        while(EcatError) printf("%s", ec_elist2string());
    }
}